

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void openjtalk_speakAsyncU16(OpenJTalk *oj,char16_t *text)

{
  OpenJTalk *oj_00;
  
  if (oj != (OpenJTalk *)0x0) {
    openjtalk_stop(oj);
    synthesisU16(oj,text);
    oj_00 = (OpenJTalk *)u16tou8(text);
    free(oj_00);
    speakasync(oj_00);
    return;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakAsyncU16(OpenJTalk *oj, const char16_t *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);
	synthesisU16(oj, text);
	char *temp = u16tou8(text);
	free(temp);
	speakasync(oj);
}